

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkCountRealPis(Wlc_Ntk_t *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  Wlc_NtkMarkCone(p,-1,-1,1,0);
  lVar2 = (long)(p->vPis).nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      iVar1 = (p->vPis).pArray[lVar3];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      iVar4 = iVar4 + (uint)((*(uint *)(p->pObjs + iVar1) >> 7 & 1) != 0);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  Wlc_NtkCleanMarks(p);
  return iVar4;
}

Assistant:

int Wlc_NtkCountRealPis( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, Count = 0;
    Wlc_NtkMarkCone( p, -1, -1, 1, 0 );
    Wlc_NtkForEachPi( p, pObj, i )
        Count += pObj->Mark;
    Wlc_NtkCleanMarks( p );
    return Count;
}